

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emitter.cpp
# Opt level: O0

void __thiscall Corrade::Interconnect::Emitter::disconnectAllSignals(Emitter *this)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_true>
  local_18;
  iterator it;
  Emitter *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_true>
             )(_Node_iterator_base<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_true>
               )this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_multimap<Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData,_Corrade::Interconnect::Implementation::SignalDataHash,_std::equal_to<Corrade::Interconnect::Implementation::SignalData>,_std::allocator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>_>_>
       ::begin(&this->_connections);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_multimap<Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData,_Corrade::Interconnect::Implementation::SignalDataHash,_std::equal_to<Corrade::Interconnect::Implementation::SignalData>,_std::allocator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>_>_>
         ::end(&this->_connections);
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_false,_true>
                           *)&local_18);
    disconnectFromReceiver(this,&ppVar2->second);
    std::__detail::
    _Node_iterator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_false,_true>
                  *)&local_18);
  }
  std::
  unordered_multimap<Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData,_Corrade::Interconnect::Implementation::SignalDataHash,_std::equal_to<Corrade::Interconnect::Implementation::SignalData>,_std::allocator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>_>_>
  ::clear(&this->_connections);
  this->_connectionsChanged = true;
  return;
}

Assistant:

void Emitter::disconnectAllSignals() {
    for(auto it = _connections.begin(); it != _connections.end(); ++it)
        disconnectFromReceiver(it->second);

    _connections.clear();
    _connectionsChanged = true;
}